

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintFunctionMap.cpp
# Opt level: O0

Pass * wasm::createPrintFunctionMapPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x30);
  memset(this,0,0x30);
  PrintFunctionMap::PrintFunctionMap((PrintFunctionMap *)this);
  return this;
}

Assistant:

Pass* createPrintFunctionMapPass() { return new PrintFunctionMap(); }